

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O1

uint luaO_tostringbuff(TValue *obj,char *buff)

{
  double dVar1;
  uint uVar2;
  size_t sVar3;
  lconv *plVar4;
  uint uVar5;
  double dVar6;
  
  if (obj->tt_ == '\x03') {
    uVar2 = snprintf(buff,0x40,"%lld",(obj->value_).gc);
    return uVar2;
  }
  dVar1 = (obj->value_).n;
  uVar2 = snprintf(buff,0x40,"%.15g");
  dVar6 = strtod(buff,(char **)0x0);
  if ((dVar6 != dVar1) || (NAN(dVar6) || NAN(dVar1))) {
    uVar2 = snprintf(buff,0x40,"%.17g",dVar1);
  }
  sVar3 = strspn(buff,"-0123456789");
  uVar5 = uVar2;
  if (buff[sVar3] == '\0') {
    plVar4 = localeconv();
    buff[(int)uVar2] = *plVar4->decimal_point;
    uVar5 = uVar2 + 2;
    buff[(long)(int)uVar2 + 1] = '0';
  }
  return uVar5;
}

Assistant:

unsigned luaO_tostringbuff (const TValue *obj, char *buff) {
  int len;
  lua_assert(ttisnumber(obj));
  if (ttisinteger(obj))
    len = lua_integer2str(buff, LUA_N2SBUFFSZ, ivalue(obj));
  else
    len = tostringbuffFloat(fltvalue(obj), buff);
  lua_assert(len < LUA_N2SBUFFSZ);
  return cast_uint(len);
}